

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node48.cpp
# Opt level: O3

Node48 * duckdb::Node48::ShrinkNode256(ART *art,Node *node48,Node *node256)

{
  ulong uVar1;
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> _Var2;
  byte bVar3;
  Node48 *pNVar4;
  type paVar5;
  iterator iVar6;
  pointer this;
  data_ptr_t pdVar7;
  long lVar8;
  ulong local_38;
  
  pNVar4 = New(art,node48);
  uVar1 = (node256->super_IndexPointer).data;
  paVar5 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
           ::operator*(&art->allocators);
  _Var2._M_head_impl =
       paVar5->_M_elems[5].
       super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
       .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
  local_38 = uVar1 & 0xffffffff;
  iVar6 = ::std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&((_Var2._M_head_impl)->buffers)._M_h,&local_38);
  this = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>::
         operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                     *)((long)iVar6.
                              super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                              ._M_cur + 0x10));
  pdVar7 = FixedSizeBuffer::Get(this,true);
  pdVar7 = pdVar7 + (_Var2._M_head_impl)->bitmask_offset +
                    (ulong)((uint)(uVar1 >> 0x20) & 0xffffff) * (_Var2._M_head_impl)->segment_size;
  (node48->super_IndexPointer).data =
       (node256->super_IndexPointer).data & 0x8000000000000000 |
       (node48->super_IndexPointer).data & 0x7fffffffffffffff;
  pNVar4->count = '\0';
  lVar8 = 1;
  bVar3 = 0;
  do {
    if (pdVar7[lVar8 * 8 + 7] == '\0') {
      pNVar4->child_index[lVar8 + -1] = '0';
    }
    else {
      pNVar4->child_index[lVar8 + -1] = bVar3;
      pNVar4->children[bVar3].super_IndexPointer.data = *(idx_t *)(pdVar7 + lVar8 * 8);
      bVar3 = bVar3 + 1;
      pNVar4->count = bVar3;
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x101);
  if (bVar3 < 0x30) {
    switchD_005681f0::default(pNVar4->children + bVar3,0,(ulong)(byte)(0x2f - bVar3) * 8 + 8);
  }
  pdVar7[0] = '\0';
  pdVar7[1] = '\0';
  Node::Free(art,node256);
  return pNVar4;
}

Assistant:

Node48 &Node48::ShrinkNode256(ART &art, Node &node48, Node &node256) {
	auto &n48 = New(art, node48);
	auto &n256 = Node::Ref<Node256>(art, node256, NType::NODE_256);
	node48.SetGateStatus(node256.GetGateStatus());

	n48.count = 0;
	for (uint16_t i = 0; i < Node256::CAPACITY; i++) {
		if (!n256.children[i].HasMetadata()) {
			n48.child_index[i] = EMPTY_MARKER;
			continue;
		}
		n48.child_index[i] = n48.count;
		n48.children[n48.count] = n256.children[i];
		n48.count++;
	}
	for (uint8_t i = n48.count; i < CAPACITY; i++) {
		n48.children[i].Clear();
	}

	n256.count = 0;
	Node::Free(art, node256);
	return n48;
}